

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::Phase<std::complex<double>_>::update
          (Phase<std::complex<double>_> *this,angle_type *angle)

{
  int iVar1;
  angle_type *angle_local;
  Phase<std::complex<double>_> *this_local;
  
  iVar1 = (*(this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>.
            _vptr_QObject[1])();
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!fixed()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/Phase.hpp"
                  ,0xb2,
                  "void qclab::qgates::Phase<std::complex<double>>::update(const angle_type &) [T = std::complex<double>]"
                 );
  }
  QAngle<double>::update(&this->angle_,angle);
  return;
}

Assistant:

void update( const angle_type& angle ) {
          assert( !fixed() ) ;
          angle_.update( angle ) ;
        }